

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O1

void __thiscall ncnn::Yolov3DetectionOutput::Yolov3DetectionOutput(Yolov3DetectionOutput *this)

{
  ParamDict pd;
  ParamDict local_30;
  
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Yolov3DetectionOutput_005ed548;
  (this->anchors_scale).cstep = 0;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->biases).data = (void *)0x0;
  (this->biases).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->biases).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->biases).elemsize + 4) = 0;
  (this->biases).allocator = (Allocator *)0x0;
  (this->biases).dims = 0;
  (this->biases).w = 0;
  (this->biases).w = 0;
  (this->biases).h = 0;
  (this->biases).d = 0;
  (this->biases).c = 0;
  (this->biases).cstep = 0;
  (this->mask).data = (void *)0x0;
  (this->mask).refcount = (int *)0x0;
  (this->mask).elemsize = 0;
  (this->mask).elempack = 0;
  (this->mask).allocator = (Allocator *)0x0;
  (this->mask).dims = 0;
  (this->mask).w = 0;
  (this->mask).w = 0;
  (this->mask).h = 0;
  (this->mask).d = 0;
  (this->mask).c = 0;
  (this->mask).cstep = 0;
  (this->anchors_scale).data = (void *)0x0;
  (this->anchors_scale).refcount = (int *)0x0;
  (this->anchors_scale).elemsize = 0;
  (this->anchors_scale).elempack = 0;
  (this->anchors_scale).allocator = (Allocator *)0x0;
  (this->anchors_scale).dims = 0;
  (this->anchors_scale).w = 0;
  (this->anchors_scale).w = 0;
  (this->anchors_scale).h = 0;
  (this->anchors_scale).d = 0;
  (this->anchors_scale).c = 0;
  ParamDict::ParamDict(&local_30);
  ParamDict::set(&local_30,0,0);
  ParamDict::~ParamDict(&local_30);
  return;
}

Assistant:

Yolov3DetectionOutput::Yolov3DetectionOutput()
{
    one_blob_only = false;
    support_inplace = false;

    //softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

    // set param
    ncnn::ParamDict pd;
    pd.set(0, 0); // axis

    //softmax->load_param(pd);
}